

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void crc_calculator_init_table(CRC_CALCULATOR *p_crc_calculator)

{
  uint uVar1;
  uint8_t mask;
  uint32_t remainder;
  uint32_t value;
  uint32_t byte_high_bit;
  uint32_t high_bit;
  CRC_CALCULATOR *p_crc_calculator_local;
  
  uVar1 = 1 << ((char)p_crc_calculator->bits - 1U & 0x1f);
  for (value = 0; value < 0x100; value = value + 1) {
    remainder = 0;
    for (mask = 0x80; mask != '\0'; mask = (uint8_t)((int)(uint)mask >> 1)) {
      if ((value & mask) != 0) {
        remainder = uVar1 ^ remainder;
      }
      if ((remainder & uVar1) == 0) {
        remainder = remainder << 1;
      }
      else {
        remainder = p_crc_calculator->trunc_poly ^ remainder << 1;
      }
    }
    p_crc_calculator->table[value] = remainder;
  }
  return;
}

Assistant:

static void crc_calculator_init_table(CRC_CALCULATOR *p_crc_calculator) {
  const uint32_t high_bit = 1 << (p_crc_calculator->bits - 1);
  const uint32_t byte_high_bit = 1 << (8 - 1);

  for (uint32_t value = 0; value < 256; value++) {
    uint32_t remainder = 0;
    for (uint8_t mask = byte_high_bit; mask != 0; mask >>= 1) {
      if (value & mask) {
        remainder ^= high_bit;
      }

      if (remainder & high_bit) {
        remainder <<= 1;
        remainder ^= p_crc_calculator->trunc_poly;
      } else {
        remainder <<= 1;
      }
    }
    p_crc_calculator->table[value] = remainder;
  }
}